

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

void __thiscall CVmConsoleMain::CVmConsoleMain(CVmConsoleMain *this)

{
  undefined1 *puVar1;
  CVmBannerManager *pCVar2;
  void **ppvVar3;
  CVmLogConsoleManager *pCVar4;
  CVmFormatterMain *this_00;
  char *pcVar5;
  CVmFormatterLog *this_01;
  long lVar6;
  EVP_PKEY_CTX *in_RSI;
  
  (this->super_CVmConsole).command_nf_ = (CVmNetFile *)0x0;
  (this->super_CVmConsole).command_glob_ = (vm_globalvar_t *)0x0;
  (this->super_CVmConsole).script_sp_ = (script_stack_entry *)0x0;
  (this->super_CVmConsole).command_fp_ = (CVmDataSource *)0x0;
  (this->super_CVmConsole).log_str_ = (CVmFormatterLog *)0x0;
  (this->super_CVmConsole).field_0x18 = (this->super_CVmConsole).field_0x18 & 0xfc | 2;
  (this->super_CVmConsole)._vptr_CVmConsole = (_func_int **)&PTR_delete_obj_0031f4d0;
  pCVar2 = (CVmBannerManager *)operator_new(0x18);
  (pCVar2->super_CVmHandleManager).handles_max_ = 0x20;
  ppvVar3 = (void **)malloc(0x100);
  (pCVar2->super_CVmHandleManager).handles_ = ppvVar3;
  lVar6 = 0;
  do {
    ppvVar3[lVar6] = (void *)0x0;
    (ppvVar3 + lVar6)[1] = (void *)0x0;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x20);
  (pCVar2->super_CVmHandleManager)._vptr_CVmHandleManager =
       (_func_int **)&PTR__CVmHandleManager_0031f6c0;
  this->banner_manager_ = pCVar2;
  pCVar4 = (CVmLogConsoleManager *)operator_new(0x18);
  (pCVar4->super_CVmHandleManager).handles_max_ = 0x20;
  ppvVar3 = (void **)malloc(0x100);
  (pCVar4->super_CVmHandleManager).handles_ = ppvVar3;
  lVar6 = 0;
  do {
    ppvVar3[lVar6] = (void *)0x0;
    (ppvVar3 + lVar6)[1] = (void *)0x0;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x20);
  (pCVar4->super_CVmHandleManager)._vptr_CVmHandleManager =
       (_func_int **)&PTR__CVmHandleManager_0031f700;
  this->log_console_manager_ = pCVar4;
  this_00 = (CVmFormatterMain *)operator_new(0xf040);
  (this_00->super_CVmFormatterDisp).super_CVmFormatter.console_ = &this->super_CVmConsole;
  (this_00->super_CVmFormatterDisp).super_CVmFormatter.tabs_ = (CVmHashTable *)0x0;
  (this_00->super_CVmFormatterDisp).super_CVmFormatter.cmap_ = (CCharmapToLocal *)0x0;
  (this_00->super_CVmFormatterDisp).super_CVmFormatter._vptr_CVmFormatter =
       (_func_int **)&PTR_delete_obj_0031f230;
  (this_00->super_CVmFormatterDisp).super_CVmFormatter.html_title_buf_size_ = 0x100;
  pcVar5 = (char *)malloc(0x100);
  (this_00->super_CVmFormatterDisp).super_CVmFormatter.html_title_buf_ = pcVar5;
  this->main_disp_str_ = this_00;
  CVmFormatterMain::init(this_00,in_RSI);
  (this->super_CVmConsole).disp_str_ = (CVmFormatter *)this->main_disp_str_;
  this_01 = (CVmFormatterLog *)operator_new(0xf060);
  (this_01->super_CVmFormatter).console_ = &this->super_CVmConsole;
  (this_01->super_CVmFormatter).tabs_ = (CVmHashTable *)0x0;
  (this_01->super_CVmFormatter).cmap_ = (CCharmapToLocal *)0x0;
  (this_01->super_CVmFormatter).html_title_buf_ = (char *)0x0;
  (this_01->super_CVmFormatter).html_title_buf_size_ = 0;
  (this_01->super_CVmFormatter)._vptr_CVmFormatter = (_func_int **)&PTR_delete_obj_0031f740;
  this_01->logfp_ = (osfildef *)0x0;
  this_01->lognf_ = (CVmNetFile *)0x0;
  this_01->logglob_ = (vm_globalvar_t *)0x0;
  this_01->width_ = 0x50;
  (this->super_CVmConsole).log_str_ = this_01;
  CVmFormatter::set_charmap((CVmFormatter *)this_01,G_cmap_to_log_X);
  (*(((this->super_CVmConsole).log_str_)->super_CVmFormatter)._vptr_CVmFormatter[1])();
  puVar1 = &(this->super_CVmConsole).field_0x18;
  *puVar1 = *puVar1 | 1;
  this->statline_str_ = (CVmFormatterStatline *)0x0;
  S_read_in_progress = 0;
  S_read_buf[0] = '\0';
  return;
}

Assistant:

CVmConsoleMain::CVmConsoleMain(VMG0_)
{
    /* create the system banner manager */
    banner_manager_ = new CVmBannerManager();

    /* create the log console manager */
    log_console_manager_ = new CVmLogConsoleManager();

    /* create and initialize our display stream */
    main_disp_str_ = new CVmFormatterMain(this, 256);
    main_disp_str_->init();

    /* initially send text to the main display stream */
    disp_str_ = main_disp_str_;

    /* 
     *   Create our log stream.  The main console always has a log stream,
     *   even when it's not in use, so that we can keep the log stream's
     *   state synchronized with the display stream in preparation for
     *   activation.  
     */
    log_str_ = new CVmFormatterLog(this, 80);

    /* 
     *   use the default log file character mapper - on some systems, files
     *   don't use the same character set as the display 
     */
    log_str_->set_charmap(G_cmap_to_log);

    /* initialize the log stream */
    log_str_->init();

    /* 
     *   the log stream is initially enabled (this is separate from the log
     *   file being opened; it merely indicates that we send output
     *   operations to the log stream for processing) 
     */
    log_enabled_ = TRUE;

    /* we don't have a statusline formatter until asked for one */
    statline_str_ = 0;

    /* reset statics */
    S_read_in_progress = FALSE;
    S_read_buf[0] = '\0';
}